

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedCrandMont_fast(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  word wVar5;
  word *a_00;
  long in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t i;
  word w;
  dword prod;
  word borrow;
  word carry;
  ulong local_58;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 auVar6 [16];
  word w_00;
  ulong uVar7;
  
  auVar6._8_8_ = in_stack_ffffffffffffffc0;
  auVar6._0_8_ = in_stack_ffffffffffffffb8;
  uVar7 = 0;
  w_00 = 0;
  for (local_58 = 0; local_58 < in_RDX; local_58 = local_58 + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI[local_58] * in_RCX;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = -*in_RSI;
    auVar6 = auVar1 * auVar2;
    uVar4 = uVar7 + in_RDI[local_58] * in_RCX;
    if (uVar7 <= uVar4) {
      in_RDI[local_58 + in_RDX] = uVar4 + in_RDI[local_58 + in_RDX];
      uVar7 = (ulong)(int)(uint)(in_RDI[local_58 + in_RDX] < uVar4);
    }
    uVar4 = w_00 + auVar6._8_8_;
    if (w_00 <= uVar4) {
      w_00 = (word)(int)(uint)(in_RDI[local_58 + 1] < uVar4);
      in_RDI[local_58 + 1] = in_RDI[local_58 + 1] - uVar4;
    }
  }
  wVar5 = zzSubW2(in_RDI + in_RDX + 1,in_RDX - 1,w_00);
  a_00 = (word *)(uVar7 - wVar5);
  wwCopy(in_RDI,in_RDI + in_RDX,in_RDX);
  in_RDI[in_RDX] = (word)a_00;
  iVar3 = wwCmp2(a_00,w_00,auVar6._8_8_,auVar6._0_8_);
  if (-1 < iVar3) {
    zzSub2(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void FAST(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register dword prod;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		if (w >= carry)
			a[i + n] += w, carry = a[i + n] < w;
		w = (word)(prod >> B_PER_W);
		w += borrow;
		if (w >= borrow)
			borrow = a[i + 1] < w, a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n
	wwCopy(a, a + n, n);
	a[n] = carry;
	// a >= mod?
	if (wwCmp2(a, n + 1, mod, n) >= 0)
		// a <- a - mod
		zzSub2(a, mod, n);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}